

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  cmListFileLexer_Token *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  string local_778;
  cmListFileBacktrace local_758;
  undefined1 local_738 [8];
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  ostringstream error;
  string local_558;
  ostringstream local_538 [8];
  ostringstream error_3;
  long local_3c0;
  unsigned_long parenDepth;
  unsigned_long lastLine;
  ostringstream local_390 [8];
  ostringstream error_2;
  string local_218;
  ostringstream local_1e8 [8];
  ostringstream error_1;
  cmListFileLexer_Token *token;
  long local_28;
  long line_local;
  char *name_local;
  cmListFileParser *this_local;
  
  local_28 = line;
  line_local = (long)name;
  name_local = (char *)this;
  memset(&token,0,0x40);
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)&token);
  cmListFileFunction::operator=(&this->Function,(cmListFileFunction *)&token);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&token);
  std::__cxx11::string::operator=((string *)&this->Function,(char *)line_local);
  (this->Function).super_cmCommandContext.Line = local_28;
  do {
    pcVar1 = cmListFileLexer_Scan(this->Lexer);
    bVar5 = false;
    if (pcVar1 != (cmListFileLexer_Token *)0x0) {
      bVar5 = pcVar1->type == cmListFileLexer_Token_Space;
    }
  } while (bVar5);
  if (pcVar1 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar2 = std::operator<<((ostream *)local_1e8,"Unexpected end of file.\n");
    std::operator<<(poVar2,"Parse error.  Function missing opening \"(\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  else if (pcVar1->type == cmListFileLexer_Token_ParenLeft) {
    local_3c0 = 0;
    this->Separation = SeparationOkay;
    do {
      while( true ) {
        while( true ) {
          lVar4 = cmListFileLexer_GetCurrentLine(this->Lexer);
          pcVar1 = cmListFileLexer_Scan(this->Lexer);
          if (pcVar1 == (cmListFileLexer_Token *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
            cmListFileContext::cmListFileContext((cmListFileContext *)&lfbt.Cur);
            std::__cxx11::string::operator=
                      ((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
            lfc.FilePath.field_2._8_8_ = lVar4;
            cmListFileBacktrace::cmListFileBacktrace
                      ((cmListFileBacktrace *)local_738,&this->Backtrace);
            cmListFileBacktrace::Push
                      (&local_758,(cmListFileBacktrace *)local_738,(cmListFileContext *)&lfbt.Cur);
            cmListFileBacktrace::operator=((cmListFileBacktrace *)local_738,&local_758);
            cmListFileBacktrace::~cmListFileBacktrace(&local_758);
            poVar2 = std::operator<<((ostream *)&lfc.Line,
                                     "Parse error.  Function missing ending \")\".  ");
            std::operator<<(poVar2,"End of file reached.");
            this_00 = this->Messenger;
            std::__cxx11::ostringstream::str();
            cmMessenger::IssueMessage
                      (this_00,FATAL_ERROR,&local_778,(cmListFileBacktrace *)local_738);
            std::__cxx11::string::~string((string *)&local_778);
            this_local._7_1_ = 0;
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_738);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&lfbt.Cur);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
            goto LAB_0056834f;
          }
          if ((pcVar1->type != cmListFileLexer_Token_Space) &&
             (pcVar1->type != cmListFileLexer_Token_Newline)) break;
          this->Separation = SeparationOkay;
        }
        if (pcVar1->type == cmListFileLexer_Token_ParenLeft) break;
        if (pcVar1->type == cmListFileLexer_Token_ParenRight) {
          if (local_3c0 == 0) {
            this_local._7_1_ = 1;
            goto LAB_0056834f;
          }
          local_3c0 = local_3c0 + -1;
          this->Separation = SeparationOkay;
          bVar5 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_0056834f;
          }
          this->Separation = SeparationWarning;
        }
        else if ((pcVar1->type == cmListFileLexer_Token_Identifier) ||
                (pcVar1->type == cmListFileLexer_Token_ArgumentUnquoted)) {
          bVar5 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_0056834f;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentQuoted) {
          bVar5 = AddArgument(this,pcVar1,Quoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_0056834f;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentBracket) {
          bVar5 = AddArgument(this,pcVar1,Bracket);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_0056834f;
          }
          this->Separation = SeparationError;
        }
        else {
          if (pcVar1->type != cmListFileLexer_Token_CommentBracket) {
            std::__cxx11::ostringstream::ostringstream(local_538);
            poVar2 = std::operator<<((ostream *)local_538,
                                     "Parse error.  Function missing ending \")\".  ");
            poVar2 = std::operator<<(poVar2,"Instead found ");
            pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
            poVar2 = std::operator<<(poVar2,pcVar3);
            poVar2 = std::operator<<(poVar2," with text \"");
            poVar2 = std::operator<<(poVar2,pcVar1->text);
            std::operator<<(poVar2,"\".");
            std::__cxx11::ostringstream::str();
            IssueError(this,&local_558);
            std::__cxx11::string::~string((string *)&local_558);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_538);
            goto LAB_0056834f;
          }
          this->Separation = SeparationError;
        }
      }
      local_3c0 = local_3c0 + 1;
      this->Separation = SeparationOkay;
      bVar5 = AddArgument(this,pcVar1,Unquoted);
    } while (bVar5);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_390);
    poVar2 = std::operator<<((ostream *)local_390,"Parse error.  Expected \"(\", got ");
    pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," with text \"");
    poVar2 = std::operator<<(poVar2,pcVar1->text);
    std::operator<<(poVar2,"\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,(string *)&lastLine);
    std::__cxx11::string::~string((string *)&lastLine);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_390);
  }
LAB_0056834f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
          token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = lastLine;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(cmake::FATAL_ERROR, error.str(), lfbt);
  return false;
}